

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O1

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::~rasterizer_cells_aa
          (rasterizer_cells_aa<agg::cell_aa> *this)

{
  uint uVar1;
  uint uVar2;
  sorted_y *psVar3;
  cell_aa **ppcVar4;
  cell_type **ppcVar5;
  
  uVar2 = this->m_num_blocks;
  if ((ulong)uVar2 != 0) {
    uVar1 = this->m_num_blocks;
    this->m_num_blocks = this->m_num_blocks - 1;
    if (uVar1 != 0) {
      ppcVar5 = this->m_cells + uVar2;
      do {
        ppcVar5 = ppcVar5 + -1;
        if (*ppcVar5 != (cell_type *)0x0) {
          operator_delete__(*ppcVar5);
        }
        uVar2 = this->m_num_blocks;
        this->m_num_blocks = this->m_num_blocks - 1;
      } while (uVar2 != 0);
    }
    if (this->m_cells != (cell_type **)0x0) {
      operator_delete__(this->m_cells);
    }
  }
  psVar3 = (this->m_sorted_y).m_array;
  if (psVar3 != (sorted_y *)0x0) {
    operator_delete__(psVar3);
  }
  ppcVar4 = (this->m_sorted_cells).m_array;
  if (ppcVar4 != (cell_aa **)0x0) {
    operator_delete__(ppcVar4);
    return;
  }
  return;
}

Assistant:

rasterizer_cells_aa<Cell>::~rasterizer_cells_aa()
    {
        if(m_num_blocks)
        {
            cell_type** ptr = m_cells + m_num_blocks - 1;
            while(m_num_blocks--)
            {
                pod_allocator<cell_type>::deallocate(*ptr, cell_block_size);
                ptr--;
            }
            pod_allocator<cell_type*>::deallocate(m_cells, m_max_blocks);
        }
    }